

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O3

void __thiscall OpenMD::LangevinPiston::LangevinPiston(LangevinPiston *this,SimInfo *info)

{
  Globals *pGVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar4;
  result_type_conflict1 rVar5;
  RandNumGen *__tmp;
  
  NPT::NPT(&this->super_NPT,info);
  (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__LangevinPiston_003015b0;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->forceDistribution_)._M_param._M_mean = 0.0;
  (this->forceDistribution_)._M_param._M_stddev = 1.0;
  (this->forceDistribution_)._M_saved = 0.0;
  (this->forceDistribution_)._M_saved_available = false;
  dVar4 = (double)((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_)->
                  nGlobalIntegrableObjects_ * 8.31451e-07 * (this->super_NPT).targetTemp;
  pGVar1 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.simParams;
  (this->super_NPT).NkBT = dVar4;
  this->W_ = dVar4 * (this->super_NPT).tb2;
  if ((pGVar1->LangevinPistonDrag).super_ParameterBase.empty_ == true) {
    memcpy(&painCave,
           "To use the LangevinPiston integrator, you must set langevinPistonDrag (fs^-1).\n",0x50);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    this->gamma_ = (pGVar1->LangevinPistonDrag).data_;
  }
  peVar2 = (info->randNumGen_).
           super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (info->randNumGen_).
           super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  this_00 = (this->randNumGen_).
            super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  dVar4 = ((this->W_ + this->W_) * this->gamma_ * 8.31451e-07 * (this->super_NPT).targetTemp) /
          (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  (this->forceDistribution_)._M_param._M_mean = 0.0;
  (this->forceDistribution_)._M_param._M_stddev = dVar4;
  (this->forceDistribution_)._M_saved = 0.0;
  (this->forceDistribution_)._M_saved_available = false;
  rVar5 = std::normal_distribution<double>::operator()
                    (&this->forceDistribution_,
                     (this->randNumGen_).
                     super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&(this->forceDistribution_)._M_param);
  this->randomForce_ = rVar5;
  return;
}

Assistant:

LangevinPiston::LangevinPiston(SimInfo* info) : NPT(info) {
    // NkBT has units of amu Ang^2 fs^-2 :
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // W_ has units of amu Ang^2
    // W_ = 3.0 * NkBT * tb2;
    W_ = NkBT * tb2;  // our eta scales all three box directions

    // gamma_ has units of fs^-1
    if (!simParams->haveLangevinPistonDrag()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "To use the LangevinPiston integrator, you must "
               "set langevinPistonDrag "
               "(fs^-1).\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      gamma_ = simParams->getLangevinPistonDrag();
    }

#ifdef IS_MPI
    if (worldRank == 0) {
#endif
      randNumGen_ = info->getRandomNumberGenerator();

      // standard deviation units: amu Angs^2 fs^-2
      RealType stdDev =
          std::sqrt(2.0 * W_ * gamma_ * Constants::kB * targetTemp / dt);

      forceDistribution_ = std::normal_distribution<RealType>(0.0, stdDev);
#ifdef IS_MPI
    }
#endif

    // randomForce will have units amu Ang^2 fs^-2:
    genRandomForce(randomForce_);
  }

  void LangevinPiston::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d Tb, ji;
    RealType mass;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;
    Vector3d sc;
    int index;

    loadEta();

    instaTemp  = thermo.getTemperature();
    press      = thermo.getPressureTensor();
    instaPress = Constants::pressureConvert *
                 (press(0, 0) + press(1, 1) + press(2, 2)) / 3.0;
    instaVol = thermo.getVolume();

    Vector3d COM = thermo.getCom();

    // evolve velocity half step

    calcVelScale();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel = sd->getVel();
        frc = sd->getFrc();

        mass = sd->getMass();

        getVelScaleA(sc, vel);

        // velocity half step

        vel += dt2 * Constants::energyConvert / mass * frc - dt2 * sc;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji += dt2 * Constants::energyConvert * Tb;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }
    // evolve eta a half step

    evolveEtaA();
    flucQ_->moveA();

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldPos[index++] = sd->getPos();
      }
    }

    // the first estimation of r(t+dt) is equal to  r(t)

    for (int k = 0; k < maxIterNum_; k++) {
      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          vel = sd->getVel();
          pos = sd->getPos();

          this->getPosScale(pos, COM, index, sc);

          pos = oldPos[index] + dt * (vel + sc);
          sd->setPos(pos);

          ++index;
        }
      }

      rattle_->constraintA();
    }

    // Scale the box after all the positions have been moved:

    this->scaleSimBox();

    saveEta();
  }

  void LangevinPiston::moveB(void) {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    int index;
    Vector3d Tb;
    Vector3d ji;
    Vector3d sc;
    Vector3d vel;
    Vector3d frc;
    RealType mass;

    loadEta();

    // save velocity and angular momentum
    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel[index] = sd->getVel();

        if (sd->isDirectional()) oldJi[index] = sd->getJ();

        ++index;
      }
    }

    instaVol = thermo.getVolume();

    for (int k = 0; k < maxIterNum_; k++) {
      instaTemp  = thermo.getTemperature();
      instaPress = thermo.getPressure();

      // evolve eta
      this->evolveEtaB();
      this->calcVelScale();

      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          getVelScaleB(sc, index);

          // velocity half step
          vel = oldVel[index] + dt2 * Constants::energyConvert / mass * frc -
                dt2 * sc;

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame
            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi[index] + dt2 * Constants::energyConvert * Tb;

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();
      if (this->etaConverged()) break;
    }

    flucQ_->moveB();
    saveEta();
  }

  void LangevinPiston::evolveEtaA() {
    // volume is Angs^3
    // pressures are in atm
    // pressureConvert takes amu*fs^-2*Ang^-1 -> atm
    eta += dt2 * (instaVol * (instaPress - targetPressure) /
                      (Constants::pressureConvert * W_) -
                  gamma_ * eta + randomForce_ / W_);
    oldEta = eta;
  }

  void LangevinPiston::evolveEtaB() {
    prevEta = eta;

    genRandomForce(randomForce_);

    eta = oldEta + dt2 * (instaVol * (instaPress - targetPressure) /
                              (Constants::pressureConvert * W_) -
                          gamma_ * eta + randomForce_ / W_);
  }

  void LangevinPiston::calcVelScale() { vScale = eta; }

  void LangevinPiston::getVelScaleA(Vector3d& sc, const Vector3d& vel) {
    sc = vScale * vel;
  }

  void LangevinPiston::getVelScaleB(Vector3d& sc, int index) {
    sc = vScale * oldVel[index];
  }

  void LangevinPiston::getPosScale(const Vector3d& pos, const Vector3d& COM,
                                   int index, Vector3d& sc) {
    Vector3d rj = (oldPos[index] + pos) / (RealType)2.0 - COM;
    sc          = eta * rj;
  }

  void LangevinPiston::scaleSimBox() {
    RealType scaleFactor;

    // This is from solving the first order equation that defines eta
    scaleFactor = exp(dt * eta);

    if ((scaleFactor > 1.1) || (scaleFactor < 0.9)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LangevinPiston error: Attempting a Box scaling of more than 10 "
               "percent\n"
               " check your tauBarostat, as it is probably too small!\n"
               " eta = %lf, scaleFactor = %lf\n",
               eta, scaleFactor);
      painCave.isFatal = 1;
      simError();
    } else {
      Mat3x3d hmat = snap->getHmat();
      hmat *= scaleFactor;
      snap->setHmat(hmat);
    }
  }

  bool LangevinPiston::etaConverged() {
    return (fabs(prevEta - eta) <= etaTolerance);
  }

  void LangevinPiston::loadEta() {
    Mat3x3d etaMat = snap->getBarostat();
    eta            = etaMat(0, 0);
  }

  void LangevinPiston::saveEta() {
    Mat3x3d etaMat(0.0);
    etaMat(0, 0) = eta;
    etaMat(1, 1) = eta;
    etaMat(2, 2) = eta;
    snap->setBarostat(etaMat);
  }

  void LangevinPiston::genRandomForce(RealType& randomForce) {
#ifdef IS_MPI
    if (worldRank == 0) {
#endif
      randomForce = forceDistribution_(*randNumGen_);
#ifdef IS_MPI
    }
    // push this out to the other processors
    // Same command on all nodes:
    MPI_Bcast(&randomForce, 1, MPI_REALTYPE, 0, MPI_COMM_WORLD);
#endif

    return;
  }
}